

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O1

void am_script_ok_proc(Am_Object *cmd)

{
  Am_Value *pAVar1;
  Am_Object undo_db;
  Am_Object script_window;
  Am_Object window;
  Am_Object sel_widget;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  Am_Object::Get_Object(&local_30,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Object(&local_28,(Am_Slot_Key)&local_30,10);
  Am_Object::~Am_Object(&local_30);
  pAVar1 = Am_Object::Get(&local_28,Am_UNDO_MENU_OF_COMMANDS,0);
  Am_Object::Am_Object(&local_30,pAVar1);
  pAVar1 = Am_Object::Get(&local_30,0x197,0);
  Am_Object::Am_Object(&local_10,pAVar1);
  pAVar1 = Am_Object::Get(&local_10,0x68,0);
  Am_Object::Am_Object(&local_18,pAVar1);
  finalize_script_execute_command(&local_28,&local_30,&local_18,true);
  Am_Object::Am_Object(&local_20,&local_28);
  done_with_script_window(&local_20);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&local_18);
  Am_Object::~Am_Object(&local_10);
  Am_Object::~Am_Object(&local_30);
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, am_script_ok, (Am_Object cmd))
{
  Am_Object script_window = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  Am_Object undo_db = script_window.Get(Am_UNDO_MENU_OF_COMMANDS);
  Am_Object sel_widget = undo_db.Get(Am_SELECTION_WIDGET);
  Am_Object window = sel_widget.Get(Am_WINDOW);
  finalize_script_execute_command(script_window, undo_db, window, true);
  done_with_script_window(script_window);
}